

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaParser.cpp
# Opt level: O0

void __thiscall
ParsedH266TrackData::ParsedH266TrackData(ParsedH266TrackData *this,uint8_t *buff,int size)

{
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_38;
  int local_1c;
  uint8_t *puStack_18;
  int size_local;
  uint8_t *buff_local;
  ParsedH266TrackData *this_local;
  
  local_1c = size;
  puStack_18 = buff;
  buff_local = (uint8_t *)this;
  ParsedH264TrackData::ParsedH264TrackData(&this->super_ParsedH264TrackData,(uint8_t *)0x0,0);
  (this->super_ParsedH264TrackData).super_ParsedTrackPrivData._vptr_ParsedTrackPrivData =
       (_func_int **)&PTR__ParsedH266TrackData_00441348;
  vvc_extract_priv_data(&local_38,puStack_18,local_1c,&(this->super_ParsedH264TrackData).m_nalSize);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::operator=(&(this->super_ParsedH264TrackData).m_spsPpsList,&local_38);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_38);
  return;
}

Assistant:

ParsedH266TrackData::ParsedH266TrackData(const uint8_t* buff, const int size) : ParsedH264TrackData(nullptr, 0)
{
    m_spsPpsList = vvc_extract_priv_data(buff, size, &m_nalSize);
}